

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void quality_display(menu *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  char *pcVar1;
  uint8_t attr_00;
  size_t sVar2;
  char *pcVar3;
  char *name_copy;
  size_t u8len;
  uint8_t attr;
  char *level_name;
  uint8_t level;
  char *name;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu *menu_local;
  
  if (oid != L'\0') {
    pcVar3 = quality_choices[oid].name;
    pcVar1 = quality_values[ignore_level[oid]].name;
    attr_00 = '\x01';
    if (cursor) {
      attr_00 = '\x0e';
    }
    sVar2 = utf8_strlen(pcVar3);
    if (sVar2 < 0x1e) {
      pcVar3 = format("%s%*s",pcVar3,(ulong)(0x1e - (int)sVar2)," ");
      c_put_str(attr_00,pcVar3,row,col);
    }
    else {
      pcVar3 = string_make(pcVar3);
      if (0x1e < sVar2) {
        utf8_clipto(pcVar3,0x1e);
      }
      c_put_str(attr_00,pcVar3,row,col);
      string_free(pcVar3);
    }
    pcVar3 = format(" : %s",pcVar1);
    c_put_str(attr_00,pcVar3,row,col + L'\x1e');
  }
  return;
}

Assistant:

static void quality_display(struct menu *menu, int oid, bool cursor, int row,
							int col, int width)
{
	if (oid) {
		/* Note: the order of the values in quality_choices do not
			align with the ignore_type_t enum order. - fix? NRM*/
		const char *name = quality_choices[oid].name;
		uint8_t level = ignore_level[oid];
		const char *level_name = quality_values[level].name;
		uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
		size_t u8len = utf8_strlen(name);

		if (u8len < 30) {
			c_put_str(attr, format("%s%*s", name, (int)(30 - u8len),
				" "), row, col);
		} else {
			char *name_copy = string_make(name);

			if (u8len > 30) {
				utf8_clipto(name_copy, 30);
			}
			c_put_str(attr, name_copy, row, col);
			string_free(name_copy);
		}
		c_put_str(attr, format(" : %s", level_name), row, col + 30);
	}
}